

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Reprepare(Vdbe *p)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe **ppVVar2;
  Vdbe *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  sqlite3_stmt *pFromStmt;
  int iVar7;
  Vdbe *p_1;
  char *pcVar8;
  sqlite3_stmt *pNew;
  Vdbe tmp;
  
  if (p == (Vdbe *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = p->zSql;
  }
  db = p->db;
  iVar7 = sqlite3LockAndPrepare(db,pcVar8,-1,(uint)p->prepFlags,p,&pNew,(char **)0x0);
  pFromStmt = pNew;
  if (iVar7 == 0) {
    memcpy(&tmp,pNew,0x130);
    memcpy(pFromStmt,p,0x130);
    memcpy(p,&tmp,0x130);
    pVVar1 = p->pVNext;
    ppVVar2 = *(Vdbe ***)(pFromStmt + 8);
    pVVar3 = *(Vdbe **)(pFromStmt + 0x10);
    *(Vdbe ***)(pFromStmt + 8) = p->ppVPrev;
    *(Vdbe **)(pFromStmt + 0x10) = pVVar1;
    p->ppVPrev = ppVVar2;
    p->pVNext = pVVar3;
    pcVar8 = *(char **)(pFromStmt + 0xf8);
    *(char **)(pFromStmt + 0xf8) = p->zSql;
    p->zSql = pcVar8;
    p->expmask = *(u32 *)(pFromStmt + 0x11c);
    p->prepFlags = (u8)pFromStmt[0xc6];
    uVar4 = *(undefined8 *)(pFromStmt + 0xd4);
    uVar5 = *(undefined8 *)(pFromStmt + 0xdc);
    uVar6 = *(undefined8 *)(pFromStmt + 0xec);
    *(undefined8 *)(p->aCounter + 4) = *(undefined8 *)(pFromStmt + 0xe4);
    *(undefined8 *)(p->aCounter + 6) = uVar6;
    p->aCounter[8] = *(u32 *)(pFromStmt + 0xf4);
    *(undefined8 *)p->aCounter = uVar4;
    *(undefined8 *)(p->aCounter + 2) = uVar5;
    p->aCounter[5] = p->aCounter[5] + 1;
    sqlite3TransferBindings(pFromStmt,(sqlite3_stmt *)p);
    *(undefined4 *)(pNew + 0x34) = 0;
    sqlite3VdbeFinalize((Vdbe *)pNew);
  }
  else if (iVar7 == 7) {
    sqlite3OomFault(db);
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3Reprepare(Vdbe *p){
  int rc;
  sqlite3_stmt *pNew;
  const char *zSql;
  sqlite3 *db;
  u8 prepFlags;

  assert( sqlite3_mutex_held(sqlite3VdbeDb(p)->mutex) );
  zSql = sqlite3_sql((sqlite3_stmt *)p);
  assert( zSql!=0 );  /* Reprepare only called for prepare_v2() statements */
  db = sqlite3VdbeDb(p);
  assert( sqlite3_mutex_held(db->mutex) );
  prepFlags = sqlite3VdbePrepareFlags(p);
  rc = sqlite3LockAndPrepare(db, zSql, -1, prepFlags, p, &pNew, 0);
  if( rc ){
    if( rc==SQLITE_NOMEM ){
      sqlite3OomFault(db);
    }
    assert( pNew==0 );
    return rc;
  }else{
    assert( pNew!=0 );
  }
  sqlite3VdbeSwap((Vdbe*)pNew, p);
  sqlite3TransferBindings(pNew, (sqlite3_stmt*)p);
  sqlite3VdbeResetStepResult((Vdbe*)pNew);
  sqlite3VdbeFinalize((Vdbe*)pNew);
  return SQLITE_OK;
}